

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

void __thiscall deqp::egl::MultiThreadedTest::~MultiThreadedTest(MultiThreadedTest *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  long lVar3;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultiThreadedTest_0210efa0;
  ppTVar1 = (this->m_threads).
            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (this->m_threads).
            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppTVar2 - (long)ppTVar1) >> 3)) {
    lVar3 = 0;
    do {
      if (ppTVar1[lVar3] != (TestThread *)0x0) {
        (*(ppTVar1[lVar3]->super_Thread)._vptr_Thread[1])();
        ppTVar1 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar2 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)((long)ppTVar2 - (long)ppTVar1) >> 3));
  }
  if (ppTVar2 != ppTVar1) {
    (this->m_threads).
    super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar1;
  }
  de::Semaphore::~Semaphore(&this->m_barrierSemaphore2);
  de::Semaphore::~Semaphore(&this->m_barrierSemaphore1);
  ppTVar1 = (this->m_threads).
            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1,(long)(this->m_threads).
                                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar1
                   );
  }
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

MultiThreadedTest::~MultiThreadedTest (void)
{
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		delete m_threads[threadNdx];
	m_threads.clear();
}